

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args)

{
  shared_ptr<fasttext::Args> *in_RDI;
  shared_ptr<fasttext::Args> *psVar1;
  allocator_type *__a;
  value_type_conflict *__value;
  size_type in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  undefined1 local_15 [21];
  
  psVar1 = in_RDI;
  std::shared_ptr<fasttext::Args>::shared_ptr(in_RDI,in_RDI);
  __a = (allocator_type *)(psVar1 + 1);
  local_15._1_4_ = 0xffffffff;
  __value = (value_type_conflict *)local_15;
  std::allocator<int>::allocator((allocator<int> *)0x199649);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__value,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x19966e);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::vector
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x19967b);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x199688);
  *(undefined4 *)
   &in_RDI[5].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0;
  *(undefined4 *)
   ((long)&in_RDI[5].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = 0;
  *(undefined4 *)&in_RDI[6].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       0;
  in_RDI[6].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI[7].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0xffffffffffffffff;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x1996ba);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args)
    : args_(args),
      word2int_(MAX_VOCAB_SIZE, -1),
      size_(0),
      nwords_(0),
      nlabels_(0),
      ntokens_(0),
      pruneidx_size_(-1) {}